

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

char16_t * openjtalk_getVoiceDirU16(OpenJTalk *oj,char16_t *path)

{
  size_t sVar1;
  char16_t *pcVar2;
  long in_RSI;
  long in_RDI;
  char16_t *res;
  char16_t *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  
  if (in_RDI == 0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  }
  else if (in_RSI == 0) {
    *(undefined4 *)(in_RDI + 0x678) = 0xc;
  }
  else {
    *(undefined4 *)(in_RDI + 0x678) = 0;
    if ((in_RDI != -0x10c) && (sVar1 = strlen((char *)(in_RDI + 0x10c)), sVar1 != 0)) {
      pcVar2 = u8tou16_path(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      return pcVar2;
    }
    *(undefined4 *)(in_RDI + 0x678) = 0xb;
  }
  return (char16_t *)0x0;
}

Assistant:

OPENJTALK_DLL_API char16_t *OPENJTALK_CONVENTION openjtalk_getVoiceDirU16(OpenJTalk *oj, char16_t *path)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return NULL;
	}

	if (!path)
	{
		oj->errorCode = OPENJTALKERROR_BUFFER_IS_NULL;
		return NULL;
	}

	oj->errorCode = OPENJTALKERROR_NO_ERROR;
	if (!oj->dn_voice_dir_path || strlen(oj->dn_voice_dir_path) == 0)
	{
		oj->errorCode = OPENJTALKERROR_PATH_STRING_IS_NULL_OR_EMPTY;
		return NULL;
	}
#if defined(_WIN32)
	char16_t *res = u8tou16_path(oj->dn_voice_dir_path, path);
#else
	char16_t *res = u8tou16_path(oj->dn_voice_dir_path, path);
#endif
	return res;
}